

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluk.c
# Opt level: O3

int ffppnuk(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,uint *array,uint nulval,
           int *status)

{
  int iVar1;
  LONGLONG firstrow;
  uint nullvalue;
  
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    firstrow = 1;
    if (1 < group) {
      firstrow = group;
    }
    ffpcnuk(fptr,2,firstrow,firstelem,nelem,array,nulval,status);
  }
  else {
    fits_write_compressed_pixels(fptr,0x1e,firstelem,nelem,1,array,&nullvalue,status);
  }
  return *status;
}

Assistant:

int ffppnuk(fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
   unsigned int   *array,    /* I - array of values that are written        */
   unsigned int   nulval,    /* I - undefined pixel value                   */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).  Any array values
  that are equal to the value of nulval will be replaced with the null
  pixel value that is appropriate for this column.
*/
{
    long row;
    unsigned int nullvalue;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        nullvalue = nulval;  /* set local variable */
        fits_write_compressed_pixels(fptr, TUINT, firstelem, nelem,
            1, array, &nullvalue, status);
        return(*status);
    }

    row=maxvalue(1,group);

    ffpcnuk(fptr, 2, row, firstelem, nelem, array, nulval, status);
    return(*status);
}